

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

unique_ptr<Catch::MultiReporter> __thiscall
Catch::Detail::make_unique<Catch::MultiReporter,Catch::Config_const*&>(Detail *this,Config **args)

{
  MultiReporter *this_00;
  Config **args_local;
  
  this_00 = (MultiReporter *)operator_new(0x40);
  MultiReporter::IEventListener(this_00,&(*args)->super_IConfig);
  unique_ptr<Catch::MultiReporter>::unique_ptr((unique_ptr<Catch::MultiReporter> *)this,this_00);
  return (unique_ptr<Catch::MultiReporter>)(MultiReporter *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }